

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O1

void __thiscall CMenus::CMenus(CMenus *this)

{
  char *pcVar1;
  int64 iVar2;
  long lVar3;
  
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CMenus_00214370;
  (this->m_lMenuImages).list = (CMenuImage *)0x0;
  array<CMenus::CMenuImage,_allocator_default<CMenus::CMenuImage>_>::clear(&this->m_lMenuImages);
  (this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>.list =
       (CTheme *)0x0;
  array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::clear
            (&(this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>);
  (this->m_lGameIcons).list = (CGameIcon *)0x0;
  array<CMenus::CGameIcon,_allocator_default<CMenus::CGameIcon>_>::clear(&this->m_lGameIcons);
  (this->m_GameIconDefault).m_Id = -1;
  (this->m_lDemos).super_array<CMenus::CDemoItem,_allocator_default<CMenus::CDemoItem>_>.list =
       (CDemoItem *)0x0;
  array<CMenus::CDemoItem,_allocator_default<CMenus::CDemoItem>_>::clear
            (&(this->m_lDemos).super_array<CMenus::CDemoItem,_allocator_default<CMenus::CDemoItem>_>
            );
  lVar3 = 0xaa0;
  do {
    pcVar1 = this->m_aPopupTitle + lVar3 + -0x43;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    array<CMenus::CFriendItem,_allocator_default<CMenus::CFriendItem>_>::clear
              ((array<CMenus::CFriendItem,_allocator_default<CMenus::CFriendItem>_> *)
               (this->m_aPopupTitle + lVar3 + -0x43));
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0xad0);
  (this->m_lFilters).list = (CBrowserFilter *)0x0;
  array<CMenus::CBrowserFilter,_allocator_default<CMenus::CBrowserFilter>_>::clear
            (&this->m_lFilters);
  (this->m_lRecommendedVideoModes).super_array<CVideoMode,_allocator_default<CVideoMode>_>.list =
       (CVideoMode *)0x0;
  array<CVideoMode,_allocator_default<CVideoMode>_>::clear
            (&(this->m_lRecommendedVideoModes).
              super_array<CVideoMode,_allocator_default<CVideoMode>_>);
  (this->m_lOtherVideoModes).super_array<CVideoMode,_allocator_default<CVideoMode>_>.list =
       (CVideoMode *)0x0;
  array<CVideoMode,_allocator_default<CVideoMode>_>::clear
            (&(this->m_lOtherVideoModes).super_array<CVideoMode,_allocator_default<CVideoMode>_>);
  CMenusKeyBinder::CMenusKeyBinder(&this->m_Binder);
  this->m_ActivePage = 5;
  this->m_GamePage = 1;
  this->m_Popup = 0;
  this->m_SidebarTab = 0;
  this->m_SidebarActive = true;
  this->m_ShowServerDetails = true;
  this->m_LastBrowserType = -1;
  this->m_AddressSelection = 0;
  this->m_aSelectedFilters[0] = -2;
  this->m_aSelectedFilters[1] = -2;
  this->m_aSelectedServers[0] = -1;
  this->m_aSelectedServers[1] = -1;
  this->m_NeedRestartSound = false;
  this->m_NeedRestartPlayer = false;
  this->m_NeedRestartGraphics = false;
  this->m_TeePartSelected = 0;
  this->m_aSaveSkinName[0] = '\0';
  this->m_RefreshSkinSelector = true;
  this->m_pSelectedSkin = (CSkin *)0x0;
  this->m_MenuActive = true;
  this->m_SeekBarActivatedTime = 0;
  this->m_SeekBarActive = true;
  this->m_SkinModified = false;
  this->m_KeyReaderWasActive = false;
  this->m_KeyReaderIsActive = false;
  SetMenuPage(this,10);
  this->m_MenuPageOld = 10;
  this->m_aDemoLoadingFile[0] = '\0';
  this->m_DemoLoadingPopupRendered = false;
  iVar2 = time_get();
  this->m_LastInput = iVar2;
  str_copy(this->m_aCurrentDemoFolder,"demos",0x200);
  this->m_aCallvoteReason[0] = '\0';
  this->m_aFilterString[0] = '\0';
  this->m_ActiveListBox = 0;
  this->m_PopupCountrySelection = -2;
  return;
}

Assistant:

CMenus::CMenus()
{
	m_Popup = POPUP_NONE;
	m_ActivePage = PAGE_INTERNET;
	m_GamePage = PAGE_GAME;

	m_SidebarTab = 0;
	m_SidebarActive = true;
	m_ShowServerDetails = true;
	m_LastBrowserType = -1;
	m_AddressSelection = 0;
	for(int Type = 0; Type < IServerBrowser::NUM_TYPES; Type++)
	{
		m_aSelectedFilters[Type] = -2;
		m_aSelectedServers[Type] = -1;
	}

	m_NeedRestartGraphics = false;
	m_NeedRestartSound = false;
	m_NeedRestartPlayer = false;
	m_TeePartSelected = SKINPART_BODY;
	m_aSaveSkinName[0] = 0;
	m_RefreshSkinSelector = true;
	m_pSelectedSkin = 0;
	m_MenuActive = true;
	m_SeekBarActivatedTime = 0;
	m_SeekBarActive = true;
	m_SkinModified = false;
	m_KeyReaderWasActive = false;
	m_KeyReaderIsActive = false;

	SetMenuPage(PAGE_START);
	m_MenuPageOld = PAGE_START;

	m_aDemoLoadingFile[0] = 0;
	m_DemoLoadingPopupRendered = false;

	m_LastInput = time_get();

	str_copy(m_aCurrentDemoFolder, "demos", sizeof(m_aCurrentDemoFolder));
	m_aCallvoteReason[0] = 0;
	m_aFilterString[0] = 0;

	m_ActiveListBox = ACTLB_NONE;

	m_PopupCountrySelection = -2;
}